

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLinkDirectoriesCommand.cxx
# Opt level: O3

void __thiscall cmLinkDirectoriesCommand::AddLinkDir(cmLinkDirectoriesCommand *this,string *dir)

{
  pointer pcVar1;
  cmMakefile *pcVar2;
  bool bVar3;
  PolicyStatus PVar4;
  ostream *poVar5;
  char *pcVar6;
  PolicyID id;
  string tmp;
  string unixPath;
  ostringstream e;
  string local_1e0;
  allocator local_1b9;
  string local_1b8;
  undefined1 local_198 [376];
  
  pcVar1 = (dir->_M_dataplus)._M_p;
  local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1b8,pcVar1,pcVar1 + dir->_M_string_length);
  cmsys::SystemTools::ConvertToUnixSlashes(&local_1b8);
  bVar3 = cmsys::SystemTools::FileIsFullPath(local_1b8._M_dataplus._M_p);
  if (bVar3) goto LAB_00325761;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_198);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_198,"This command specifies the relative path\n",0x29);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"  ",2);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_198,local_1b8._M_dataplus._M_p,local_1b8._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"as a link directory.\n",0x15);
  PVar4 = cmMakefile::GetPolicyStatus((this->super_cmCommand).Makefile,CMP0015);
  if (PVar4 - REQUIRED_IF_USED < 2) {
    cmPolicies::GetRequiredPolicyError_abi_cxx11_(&local_1e0,(cmPolicies *)0xf,id);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_198,local_1e0._M_dataplus._M_p,local_1e0._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
      operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
    }
    pcVar2 = (this->super_cmCommand).Makefile;
    std::__cxx11::stringbuf::str();
    cmMakefile::IssueMessage(pcVar2,FATAL_ERROR,&local_1e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
      operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
    }
LAB_003256d9:
    pcVar6 = cmMakefile::GetCurrentSourceDirectory((this->super_cmCommand).Makefile);
    std::__cxx11::string::string((string *)&local_1e0,pcVar6,&local_1b9);
    std::__cxx11::string::append((char *)&local_1e0);
    std::__cxx11::string::_M_append((char *)&local_1e0,(ulong)local_1b8._M_dataplus._M_p);
    std::__cxx11::string::_M_assign((string *)&local_1b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
LAB_00325736:
      operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
    }
  }
  else if (PVar4 == WARN) {
    cmPolicies::GetPolicyWarning_abi_cxx11_(&local_1e0,(cmPolicies *)0xf,id);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_198,local_1e0._M_dataplus._M_p,local_1e0._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
      operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
    }
    pcVar2 = (this->super_cmCommand).Makefile;
    std::__cxx11::stringbuf::str();
    cmMakefile::IssueMessage(pcVar2,AUTHOR_WARNING,&local_1e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) goto LAB_00325736;
  }
  else if (PVar4 == NEW) goto LAB_003256d9;
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_198);
  std::ios_base::~ios_base((ios_base *)(local_198 + 0x70));
LAB_00325761:
  cmMakefile::AddLinkDirectory((this->super_cmCommand).Makefile,&local_1b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
    operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmLinkDirectoriesCommand::AddLinkDir(std::string const& dir)
{
  std::string unixPath = dir;
  cmSystemTools::ConvertToUnixSlashes(unixPath);
  if(!cmSystemTools::FileIsFullPath(unixPath.c_str()))
    {
    bool convertToAbsolute = false;
    std::ostringstream e;
    e << "This command specifies the relative path\n"
      << "  " << unixPath << "\n"
      << "as a link directory.\n";
    switch (this->Makefile->GetPolicyStatus(cmPolicies::CMP0015))
      {
      case cmPolicies::WARN:
        e << cmPolicies::GetPolicyWarning(cmPolicies::CMP0015);
        this->Makefile->IssueMessage(cmake::AUTHOR_WARNING, e.str());
      case cmPolicies::OLD:
        // OLD behavior does not convert
        break;
      case cmPolicies::REQUIRED_IF_USED:
      case cmPolicies::REQUIRED_ALWAYS:
        e << cmPolicies::GetRequiredPolicyError(cmPolicies::CMP0015);
        this->Makefile->IssueMessage(cmake::FATAL_ERROR, e.str());
      case cmPolicies::NEW:
        // NEW behavior converts
        convertToAbsolute = true;
        break;
      }
    if (convertToAbsolute)
      {
      std::string tmp = this->Makefile->GetCurrentSourceDirectory();
      tmp += "/";
      tmp += unixPath;
      unixPath = tmp;
      }
    }
  this->Makefile->AddLinkDirectory(unixPath);
}